

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# solver-opt.h
# Opt level: O3

void __thiscall
mp::InvalidOptionValue::InvalidOptionValue<int>
          (InvalidOptionValue *this,StringRef name,int value,StringRef msg)

{
  StringRef name_00;
  StringRef msg_00;
  int in_stack_ffffffffffffffcc;
  CStringRef in_stack_ffffffffffffffd0;
  size_t in_stack_ffffffffffffffd8;
  char *in_stack_ffffffffffffffe0;
  size_t in_stack_ffffffffffffffe8;
  
  name_00.size_ = in_stack_ffffffffffffffd8;
  name_00.data_ = in_stack_ffffffffffffffd0.data_;
  msg_00.size_ = in_stack_ffffffffffffffe8;
  msg_00.data_ = in_stack_ffffffffffffffe0;
  Format<int>(name_00,in_stack_ffffffffffffffcc,msg_00);
  Error::Error((Error *)this,in_stack_ffffffffffffffd0,-1);
  *(undefined ***)&(this->super_OptionError).super_Error.super_RuntimeError =
       &PTR__SystemError_005cc490;
  if (in_stack_ffffffffffffffd0.data_ != &stack0xffffffffffffffe0) {
    operator_delete(in_stack_ffffffffffffffd0.data_,(ulong)(in_stack_ffffffffffffffe0 + 1));
  }
  *(undefined ***)&(this->super_OptionError).super_Error.super_RuntimeError =
       &PTR__SystemError_005cc4d0;
  return;
}

Assistant:

InvalidOptionValue(fmt::StringRef name, T value, fmt::StringRef msg="")
    : OptionError(Format(name, value, msg)) {}